

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxConditional::Emit(FxConditional *this,VMFunctionBuilder *build)

{
  uint16_t opbc;
  FxConditional *pFVar1;
  uint uVar2;
  int iVar3;
  uint extraout_var;
  size_t loc;
  ExpEmit EVar4;
  ExpEmit local_b0;
  ExpEmit falseop;
  ExpEmit local_98;
  ExpEmit local_90;
  ExpEmit local_88;
  ExpEmit local_80;
  ExpEmit trueop;
  ExpEmit local_64 [2];
  undefined1 local_50 [8];
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  ExpEmit falseout;
  size_t truejump;
  VMFunctionBuilder *build_local;
  FxConditional *this_local;
  ExpEmit out;
  uint extraout_var_00;
  
  ExpEmit::ExpEmit((ExpEmit *)&this_local);
  ExpEmit::ExpEmit((ExpEmit *)&yes.Most);
  TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
  TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)local_50);
  (*this->condition->_vptr_FxExpression[10])(this->condition,build,0,&no.Most);
  VMFunctionBuilder::BackpatchListToHere(build,(TArray<unsigned_long,_unsigned_long> *)&no.Most);
  uVar2 = (*this->truex->_vptr_FxExpression[3])();
  if (((uVar2 & 1) == 0) || (iVar3 = PType::GetRegType(this->truex->ValueType), iVar3 != 0)) {
    local_80._0_4_ = (*this->truex->_vptr_FxExpression[9])(this->truex,build);
    local_80.Konst = (bool)(char)extraout_var;
    local_80.Fixed = (bool)(char)(extraout_var >> 8);
    local_80.Final = (bool)(char)(extraout_var >> 0x10);
    local_80.Target = (bool)(char)(extraout_var >> 0x18);
    this_local = (FxConditional *)local_80;
    if ((extraout_var & 1) != 0) {
      ExpEmit::Free(&local_80,build);
      if (local_80.RegType == '\x01') {
        ExpEmit::ExpEmit(&local_88,build,1,1);
        this_local = (FxConditional *)local_88;
        pFVar1 = this_local;
        this_local._0_2_ = local_88.RegNum;
        uVar2 = (uint)(ushort)this_local;
        this_local = pFVar1;
        VMFunctionBuilder::Emit(build,3,uVar2,local_80.RegNum);
      }
      else if (local_80.RegType == '\x03') {
        ExpEmit::ExpEmit(&local_90,build,3,1);
        this_local = (FxConditional *)local_90;
        pFVar1 = this_local;
        this_local._0_2_ = local_90.RegNum;
        uVar2 = (uint)(ushort)this_local;
        this_local = pFVar1;
        VMFunctionBuilder::Emit(build,5,uVar2,local_80.RegNum);
      }
      else {
        if (local_80.RegType != '\x02') {
          __assert_fail("trueop.RegType == REGT_STRING",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0x11e3,"virtual ExpEmit FxConditional::Emit(VMFunctionBuilder *)");
        }
        ExpEmit::ExpEmit(&local_98,build,2,1);
        this_local = (FxConditional *)local_98;
        pFVar1 = this_local;
        this_local._0_2_ = local_98.RegNum;
        uVar2 = (uint)(ushort)this_local;
        this_local = pFVar1;
        VMFunctionBuilder::Emit(build,4,uVar2,local_80.RegNum);
      }
    }
  }
  else {
    ExpEmit::ExpEmit(local_64,build,0,1);
    this_local = (FxConditional *)local_64[0];
    pFVar1 = this_local;
    this_local._0_2_ = local_64[0].RegNum;
    uVar2 = (uint)(ushort)this_local;
    this_local = pFVar1;
    FxConstant::GetValue((FxConstant *)&trueop);
    iVar3 = ExpVal::GetInt((ExpVal *)&trueop);
    VMFunctionBuilder::EmitLoadInt(build,uVar2,iVar3);
    ExpVal::~ExpVal((ExpVal *)&trueop);
  }
  loc = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::BackpatchListToHere(build,(TArray<unsigned_long,_unsigned_long> *)local_50);
  uVar2 = (*this->falsex->_vptr_FxExpression[3])();
  if (((uVar2 & 1) == 0) || (iVar3 = PType::GetRegType(this->falsex->ValueType), iVar3 != 0)) {
    EVar4._0_4_ = (*this->falsex->_vptr_FxExpression[9])(this->falsex,build);
    EVar4.Konst = (bool)(char)extraout_var_00;
    EVar4.Fixed = (bool)(char)(extraout_var_00 >> 8);
    EVar4.Final = (bool)(char)(extraout_var_00 >> 0x10);
    EVar4.Target = (bool)(char)(extraout_var_00 >> 0x18);
    local_b0 = EVar4;
    if ((extraout_var_00 & 1) == 0) {
      ExpEmit::Free(&local_b0,build);
      iVar3 = PType::GetMoveOp(this->falsex->ValueType);
      VMFunctionBuilder::Emit(build,iVar3,(uint)(ushort)this_local,(uint)local_b0.RegNum,0);
    }
    else {
      local_b0.RegType = (uint8_t)((uint)EVar4._0_4_ >> 0x10);
      local_b0.RegNum = (uint16_t)EVar4._0_4_;
      opbc = local_b0.RegNum;
      if (local_b0.RegType == '\x01') {
        VMFunctionBuilder::Emit(build,3,(uint)(ushort)this_local,opbc);
      }
      else if (local_b0.RegType == '\x03') {
        VMFunctionBuilder::Emit(build,5,(uint)(ushort)this_local,opbc);
      }
      else {
        if (local_b0.RegType != '\x02') {
          __assert_fail("falseop.RegType == REGT_STRING",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0x1207,"virtual ExpEmit FxConditional::Emit(VMFunctionBuilder *)");
        }
        VMFunctionBuilder::Emit(build,4,(uint)(ushort)this_local,opbc);
      }
      ExpEmit::Free(&local_b0,build);
    }
  }
  else {
    uVar2 = (uint)(ushort)this_local;
    FxConstant::GetValue((FxConstant *)&falseop);
    iVar3 = ExpVal::GetInt((ExpVal *)&falseop);
    VMFunctionBuilder::EmitLoadInt(build,uVar2,iVar3);
    ExpVal::~ExpVal((ExpVal *)&falseop);
  }
  VMFunctionBuilder::BackpatchToHere(build,loc);
  TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)local_50);
  TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxConditional::Emit(VMFunctionBuilder *build)
{
	size_t truejump;
	ExpEmit out, falseout;

	// The true and false expressions ought to be assigned to the
	// same temporary instead of being copied to it. Oh well; good enough
	// for now.
	TArray<size_t> yes, no;
	condition->EmitCompare(build, false, yes, no);

	build->BackpatchListToHere(yes);

	if (truex->isConstant() && truex->ValueType->GetRegType() == REGT_INT)
	{
		out = ExpEmit(build, REGT_INT);
		build->EmitLoadInt(out.RegNum, static_cast<FxConstant *>(truex)->GetValue().GetInt());
	}
	else
	{
		ExpEmit trueop = truex->Emit(build);
		if (trueop.Konst)
		{
			trueop.Free(build);
			if (trueop.RegType == REGT_FLOAT)
			{
				out = ExpEmit(build, REGT_FLOAT);
				build->Emit(OP_LKF, out.RegNum, trueop.RegNum);
			}
			else if (trueop.RegType == REGT_POINTER)
			{
				out = ExpEmit(build, REGT_POINTER);
				build->Emit(OP_LKP, out.RegNum, trueop.RegNum);
			}
			else
			{
				assert(trueop.RegType == REGT_STRING);
				out = ExpEmit(build, REGT_STRING);
				build->Emit(OP_LKS, out.RegNum, trueop.RegNum);
			}
		}
		else
		{
			// Use the register returned by the true condition as the
			// target for the false condition.
			out = trueop;
		}
	}
	// Make sure to skip the false path.
	truejump = build->Emit(OP_JMP, 0);

	// Evaluate false expression.
	build->BackpatchListToHere(no);
	if (falsex->isConstant() && falsex->ValueType->GetRegType() == REGT_INT)
	{
		build->EmitLoadInt(out.RegNum, static_cast<FxConstant *>(falsex)->GetValue().GetInt());
	}
	else
	{
		ExpEmit falseop = falsex->Emit(build);
		if (falseop.Konst)
		{
			if (falseop.RegType == REGT_FLOAT)
			{
				build->Emit(OP_LKF, out.RegNum, falseop.RegNum);
			}
			else if (falseop.RegType == REGT_POINTER)
			{
				build->Emit(OP_LKP, out.RegNum, falseop.RegNum);
			}
			else
			{
				assert(falseop.RegType == REGT_STRING);
				build->Emit(OP_LKS, out.RegNum, falseop.RegNum);
			}
			falseop.Free(build);
		}
		else
		{
			// Move result from the register returned by "false" to the one
			// returned by "true" so that only one register is returned by
			// this tree.
			falseop.Free(build);
			build->Emit(falsex->ValueType->GetMoveOp(), out.RegNum, falseop.RegNum, 0);
		}
	}
	build->BackpatchToHere(truejump);

	return out;
}